

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::ParsedPatternInfo::consumeSubpattern
          (ParsedPatternInfo *this,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  ParsedPatternInfo *this_local;
  
  consumePadding(this,UNUM_PAD_BEFORE_PREFIX,status);
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    consumeAffix(this,&this->currentSubpattern->prefixEndpoints,status);
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 == '\0') {
      consumePadding(this,UNUM_PAD_AFTER_PREFIX,status);
      UVar1 = ::U_FAILURE(*status);
      if (UVar1 == '\0') {
        consumeFormat(this,status);
        UVar1 = ::U_FAILURE(*status);
        if (UVar1 == '\0') {
          consumeExponent(this,status);
          UVar1 = ::U_FAILURE(*status);
          if (UVar1 == '\0') {
            consumePadding(this,UNUM_PAD_BEFORE_SUFFIX,status);
            UVar1 = ::U_FAILURE(*status);
            if (UVar1 == '\0') {
              consumeAffix(this,&this->currentSubpattern->suffixEndpoints,status);
              UVar1 = ::U_FAILURE(*status);
              if (UVar1 == '\0') {
                consumePadding(this,UNUM_PAD_AFTER_SUFFIX,status);
                ::U_FAILURE(*status);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ParsedPatternInfo::consumeSubpattern(UErrorCode& status) {
    // subpattern := literals? number exponent? literals?
    consumePadding(PadPosition::UNUM_PAD_BEFORE_PREFIX, status);
    if (U_FAILURE(status)) { return; }
    consumeAffix(currentSubpattern->prefixEndpoints, status);
    if (U_FAILURE(status)) { return; }
    consumePadding(PadPosition::UNUM_PAD_AFTER_PREFIX, status);
    if (U_FAILURE(status)) { return; }
    consumeFormat(status);
    if (U_FAILURE(status)) { return; }
    consumeExponent(status);
    if (U_FAILURE(status)) { return; }
    consumePadding(PadPosition::UNUM_PAD_BEFORE_SUFFIX, status);
    if (U_FAILURE(status)) { return; }
    consumeAffix(currentSubpattern->suffixEndpoints, status);
    if (U_FAILURE(status)) { return; }
    consumePadding(PadPosition::UNUM_PAD_AFTER_SUFFIX, status);
    if (U_FAILURE(status)) { return; }
}